

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_custom_type_2>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
::drop_deletes_without_resize
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_custom_type_2>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
           *this)

{
  slot_type *psVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  ulong capacity;
  slot_type *psVar4;
  slot_type *psVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  uint32_t uVar13;
  undefined4 uVar14;
  uint32_t uVar15;
  undefined4 uVar16;
  size_t pos;
  size_t sVar17;
  size_t sVar18;
  long lVar19;
  byte bVar20;
  long lVar21;
  size_t new_capacity;
  FindInfo FVar22;
  size_t hashval;
  anon_class_16_2_f7bee600 probe_index;
  type raw;
  
  capacity = this->capacity_;
  if ((capacity == 0) || ((capacity + 1 & capacity) != 0)) {
    __assert_fail("IsValidCapacity(capacity_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x822,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<int, custom_type_2>, phmap::Hash<int32_t>, phmap::EqualTo<int>, std::allocator<std::pair<const int, custom_type_2>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<int, custom_type_2>, Hash = phmap::Hash<int32_t>, Eq = phmap::EqualTo<int>, Alloc = std::allocator<std::pair<const int, custom_type_2>>]"
                 );
  }
  if (capacity < 0xf) {
    __assert_fail("!is_small()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x823,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<int, custom_type_2>, phmap::Hash<int32_t>, phmap::EqualTo<int>, std::allocator<std::pair<const int, custom_type_2>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<int, custom_type_2>, Hash = phmap::Hash<int32_t>, Eq = phmap::EqualTo<int>, Alloc = std::allocator<std::pair<const int, custom_type_2>>]"
                 );
  }
  ConvertDeletedToEmptyAndFullToDeleted(this->ctrl_,capacity);
  new_capacity = 0;
  do {
    if (new_capacity == this->capacity_) {
      reset_growth_left(this,new_capacity);
      return;
    }
    if (this->ctrl_[new_capacity] == -2) {
      lVar21 = new_capacity * 0x28;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = (long)this->slots_[new_capacity].value.first;
      hashval = SUB168(auVar7 * ZEXT816(0xde5fb9d2630458e9),8) +
                SUB168(auVar7 * ZEXT816(0xde5fb9d2630458e9),0);
      FVar22 = find_first_non_full(this,hashval);
      pos = FVar22.offset;
      probe_index.hashval = &hashval;
      probe_index.this = this;
      sVar17 = drop_deletes_without_resize::anon_class_16_2_f7bee600::operator()(&probe_index,pos);
      sVar18 = drop_deletes_without_resize::anon_class_16_2_f7bee600::operator()
                         (&probe_index,new_capacity);
      bVar20 = (byte)hashval;
      if (sVar17 == sVar18) {
        bVar20 = bVar20 & 0x7f;
      }
      else {
        if (this->ctrl_[pos] == -2) {
          set_ctrl(this,pos,bVar20 & 0x7f);
          psVar5 = this->slots_;
          uVar6 = *(undefined8 *)((long)psVar5 + lVar21 + 0x20);
          psVar1 = psVar5 + new_capacity;
          uVar8 = *(undefined8 *)psVar1;
          uVar15 = ((custom_type_2 *)((long)psVar1 + 8))->three;
          uVar16 = *(undefined4 *)&((custom_type_2 *)((long)psVar1 + 8))->field_0x4;
          puVar2 = (undefined8 *)((long)psVar5 + lVar21 + 0x10);
          uVar9 = *puVar2;
          uVar10 = puVar2[1];
          lVar19 = pos * 0x28;
          psVar1 = psVar5 + pos;
          uVar13 = ((custom_type_2 *)((long)psVar1 + 8))->three;
          uVar14 = *(undefined4 *)&((custom_type_2 *)((long)psVar1 + 8))->field_0x4;
          puVar2 = (undefined8 *)((long)psVar5 + lVar19 + 0x10);
          uVar11 = *puVar2;
          uVar12 = puVar2[1];
          psVar4 = psVar5 + new_capacity;
          *(undefined8 *)psVar4 = *(undefined8 *)psVar1;
          ((custom_type_2 *)((long)psVar4 + 8))->three = uVar13;
          *(undefined4 *)&((custom_type_2 *)((long)psVar4 + 8))->field_0x4 = uVar14;
          puVar2 = (undefined8 *)((long)psVar5 + lVar21 + 0x10);
          *puVar2 = uVar11;
          puVar2[1] = uVar12;
          *(undefined8 *)((long)psVar5 + lVar21 + 0x20) =
               *(undefined8 *)((long)psVar5 + lVar19 + 0x20);
          psVar4 = this->slots_;
          psVar1 = psVar4 + pos;
          *(undefined8 *)psVar1 = uVar8;
          ((custom_type_2 *)((long)psVar1 + 8))->three = uVar15;
          *(undefined4 *)&((custom_type_2 *)((long)psVar1 + 8))->field_0x4 = uVar16;
          *(undefined8 *)((long)psVar4 + lVar19 + 0x20) = uVar6;
          puVar2 = (undefined8 *)((long)psVar4 + lVar19 + 0x10);
          *puVar2 = uVar9;
          puVar2[1] = uVar10;
          new_capacity = new_capacity - 1;
          goto LAB_00103773;
        }
        if (this->ctrl_[pos] != -0x80) {
          __assert_fail("IsDeleted(ctrl_[new_i])",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                        ,0x853,
                        "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<int, custom_type_2>, phmap::Hash<int32_t>, phmap::EqualTo<int>, std::allocator<std::pair<const int, custom_type_2>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<int, custom_type_2>, Hash = phmap::Hash<int32_t>, Eq = phmap::EqualTo<int>, Alloc = std::allocator<std::pair<const int, custom_type_2>>]"
                       );
        }
        set_ctrl(this,pos,bVar20 & 0x7f);
        psVar4 = this->slots_;
        *(undefined8 *)((long)psVar4 + pos * 0x28 + 0x20) =
             *(undefined8 *)((long)psVar4 + lVar21 + 0x20);
        psVar1 = psVar4 + new_capacity;
        uVar6 = *(undefined8 *)psVar1;
        uVar13 = ((custom_type_2 *)((long)psVar1 + 8))->three;
        uVar14 = *(undefined4 *)&((custom_type_2 *)((long)psVar1 + 8))->field_0x4;
        puVar2 = (undefined8 *)((long)psVar4 + lVar21 + 0x10);
        uVar8 = puVar2[1];
        puVar3 = (undefined8 *)((long)psVar4 + pos * 0x28 + 0x10);
        *puVar3 = *puVar2;
        puVar3[1] = uVar8;
        psVar4 = psVar4 + pos;
        *(undefined8 *)psVar4 = uVar6;
        ((custom_type_2 *)((long)psVar4 + 8))->three = uVar13;
        *(undefined4 *)&((custom_type_2 *)((long)psVar4 + 8))->field_0x4 = uVar14;
        bVar20 = 0x80;
      }
      set_ctrl(this,new_capacity,bVar20);
    }
LAB_00103773:
    new_capacity = new_capacity + 1;
  } while( true );
}

Assistant:

void drop_deletes_without_resize() PHMAP_ATTRIBUTE_NOINLINE {
        assert(IsValidCapacity(capacity_));
        assert(!is_small());
        // Algorithm:
        // - mark all DELETED slots as EMPTY
        // - mark all FULL slots as DELETED
        // - for each slot marked as DELETED
        //     hash = Hash(element)
        //     target = find_first_non_full(hash)
        //     if target is in the same group
        //       mark slot as FULL
        //     else if target is EMPTY
        //       transfer element to target
        //       mark slot as EMPTY
        //       mark target as FULL
        //     else if target is DELETED
        //       swap current element with target element
        //       mark target as FULL
        //       repeat procedure for current slot with moved from element (target)
        ConvertDeletedToEmptyAndFullToDeleted(ctrl_, capacity_);
        typename phmap::aligned_storage<sizeof(slot_type), alignof(slot_type)>::type
            raw;
        slot_type* slot = reinterpret_cast<slot_type*>(&raw);
        for (size_t i = 0; i != capacity_; ++i) {
            if (!IsDeleted(ctrl_[i])) continue;
            size_t hashval = PolicyTraits::apply(HashElement{hash_ref()},
                                                 PolicyTraits::element(slots_ + i));
            auto target = find_first_non_full(hashval);
            size_t new_i = target.offset;

            // Verify if the old and new i fall within the same group wrt the hashval.
            // If they do, we don't need to move the object as it falls already in the
            // best probe we can.
            const auto probe_index = [&](size_t pos) {
                return ((pos - probe(hashval).offset()) & capacity_) / Group::kWidth;
            };

            // Element doesn't move.
            if (PHMAP_PREDICT_TRUE(probe_index(new_i) == probe_index(i))) {
                set_ctrl(i, H2(hashval));
                continue;
            }
            if (IsEmpty(ctrl_[new_i])) {
                // Transfer element to the empty spot.
                // set_ctrl poisons/unpoisons the slots so we have to call it at the
                // right time.
                set_ctrl(new_i, H2(hashval));
                PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slots_ + i);
                set_ctrl(i, kEmpty);
            } else {
                assert(IsDeleted(ctrl_[new_i]));
                set_ctrl(new_i, H2(hashval));
                // Until we are done rehashing, DELETED marks previously FULL slots.
                // Swap i and new_i elements.
                PolicyTraits::transfer(&alloc_ref(), slot, slots_ + i);
                PolicyTraits::transfer(&alloc_ref(), slots_ + i, slots_ + new_i);
                PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slot);
                --i;  // repeat
            }
        }
        reset_growth_left(capacity_);
    }